

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiObjectManagementTests.cpp
# Opt level: O1

TestStatus *
vkt::api::anon_unknown_1::allocCallbackFailTest<vkt::api::(anonymous_namespace)::ComputePipeline>
          (TestStatus *__return_storage_ptr__,Context *context)

{
  string *psVar1;
  PlatformInterface *pPVar2;
  char *pcVar3;
  Deleter<vk::VkInstance_s_*> **ppDVar4;
  bool bVar5;
  int iVar6;
  VkAllocationCallbacks *pVVar7;
  DeviceInterface *pDVar8;
  VkDevice pVVar9;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar10;
  ulong uVar11;
  Parameters *pPVar12;
  Parameters *extraout_RDX;
  int iVar13;
  ulong uVar14;
  Environment rootEnv;
  Environment objEnv;
  AllocationCallbackRecorder resCallbacks;
  DeterministicFailAllocator objAllocator;
  AllocationCallbackRecorder recorder;
  EnvClone resEnv;
  Resources res;
  Environment local_ab8;
  Environment local_a80;
  undefined1 local_a48 [8];
  Deleter<vk::Handle<(vk::HandleType)18>_> aDStack_a40 [4];
  ios_base local_9d0 [264];
  Move<vk::Handle<(vk::HandleType)18>_> local_8c8;
  AllocationCallbackRecorder local_8a0;
  DeterministicFailAllocator local_840;
  AllocationCallbackRecorder local_7f0;
  EnvClone local_790;
  Resources local_d0;
  
  pVVar7 = ::vk::getSystemAllocator();
  ::vk::AllocationCallbackRecorder::AllocationCallbackRecorder(&local_8a0,pVVar7,0x80);
  pPVar2 = context->m_platformInterface;
  pDVar8 = Context::getDeviceInterface(context);
  pVVar9 = Context::getDevice(context);
  local_ab8.queueFamilyIndex = Context::getUniversalQueueFamilyIndex(context);
  local_ab8.programBinaries = context->m_progCollection;
  local_ab8.allocationCallbacks =
       &local_8a0.super_ChainedAllocator.super_AllocationCallbacks.m_callbacks;
  local_ab8.maxResourceConsumers = 1;
  local_ab8.vkp = pPVar2;
  local_ab8.vkd = pDVar8;
  local_ab8.device = pVVar9;
  iVar6 = tcu::CommandLine::getTestIterationCount(context->m_testCtx->m_cmdLine);
  iVar13 = 0x400;
  if (iVar6 != 0) {
    iVar13 = iVar6;
  }
  iVar6 = tcu::CommandLine::getVKDeviceId(context->m_testCtx->m_cmdLine);
  local_a48 = (undefined1  [8])((ulong)(iVar6 - 1U) | 0x300000000);
  EnvClone::EnvClone(&local_790,&local_ab8,(Parameters *)local_a48,iVar6 - 1U);
  ComputePipeline::Resources::Resources(&local_d0,&local_790.env,extraout_RDX);
  psVar1 = &__return_storage_ptr__->m_description;
  paVar10 = &(__return_storage_ptr__->m_description).field_2;
  uVar11 = (ulong)(iVar13 + (uint)(iVar13 == 0));
  uVar14 = 0;
  while( true ) {
    pVVar7 = ::vk::getSystemAllocator();
    ::vk::DeterministicFailAllocator::DeterministicFailAllocator
              (&local_840,pVVar7,MODE_COUNT_AND_FAIL,(deUint32)uVar14);
    ::vk::AllocationCallbackRecorder::AllocationCallbackRecorder
              (&local_7f0,&local_840.super_ChainedAllocator.super_AllocationCallbacks.m_callbacks,
               0x80);
    pPVar12 = (Parameters *)(ulong)local_790.env.queueFamilyIndex;
    local_a80.vkp = local_790.env.vkp;
    local_a80.vkd = local_790.env.vkd;
    local_a80.device = local_790.env.device;
    local_a80.queueFamilyIndex = local_790.env.queueFamilyIndex;
    local_a80.programBinaries = local_790.env.programBinaries;
    local_a80.allocationCallbacks =
         &local_7f0.super_ChainedAllocator.super_AllocationCallbacks.m_callbacks;
    local_a80.maxResourceConsumers = local_790.env.maxResourceConsumers;
    local_a48 = (undefined1  [8])context->m_testCtx->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)aDStack_a40);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)aDStack_a40,"Trying to create object with ",0x1d);
    std::ostream::_M_insert<unsigned_long>((ulong)aDStack_a40);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)aDStack_a40," allocation",0xb);
    pcVar3 = ",\n\t\t";
    if (uVar14 != 1) {
      pcVar3 = "%s<%s";
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)aDStack_a40,pcVar3 + 4,(ulong)(uVar14 != 1));
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)aDStack_a40," passing",8);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_a48,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)aDStack_a40);
    std::ios_base::~ios_base(local_9d0);
    ComputePipeline::create(&local_8c8,&local_a80,&local_d0,pPVar12);
    aDStack_a40[0].m_device =
         local_8c8.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_device;
    aDStack_a40[0].m_allocator =
         local_8c8.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_allocator;
    local_a48 = (undefined1  [8])
                local_8c8.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.m_internal;
    aDStack_a40[0].m_deviceIface =
         local_8c8.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_deviceIface;
    if (local_8c8.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.m_internal != 0) {
      ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)18>_>::operator()
                (aDStack_a40,
                 (VkPipeline)
                 local_8c8.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.m_internal);
    }
    bVar5 = ::vk::validateAndLog(context->m_testCtx->m_log,&local_7f0,0);
    if (bVar5) {
      local_a48 = (undefined1  [8])context->m_testCtx->m_log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)aDStack_a40);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)aDStack_a40,"Object construction succeeded! ",0x1f);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_a48,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)aDStack_a40);
      std::ios_base::~ios_base(local_9d0);
      iVar6 = 2;
    }
    else {
      local_a48 = (undefined1  [8])&aDStack_a40[0].m_device;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_a48,"Invalid allocation callback","");
      __return_storage_ptr__->m_code = QP_TEST_RESULT_FAIL;
      (__return_storage_ptr__->m_description)._M_dataplus._M_p = (pointer)paVar10;
      std::__cxx11::string::_M_construct<char*>
                ((string *)psVar1,local_a48,
                 (long)local_a48 + (long)&(aDStack_a40[0].m_deviceIface)->_vptr_DeviceInterface);
      if (local_a48 != (undefined1  [8])&aDStack_a40[0].m_device) {
        operator_delete((void *)local_a48,(ulong)(aDStack_a40[0].m_device + 1));
      }
      iVar6 = 1;
    }
    ::vk::AllocationCallbackRecorder::~AllocationCallbackRecorder(&local_7f0);
    ::vk::ChainedAllocator::~ChainedAllocator(&local_840.super_ChainedAllocator);
    if (iVar6 != 0) break;
    uVar14 = uVar14 + 1;
    if (uVar11 == uVar14) {
      bVar5 = true;
      uVar14 = uVar11;
LAB_004020ce:
      ComputePipeline::Resources::~Resources(&local_d0);
      ::vk::DeviceDriver::~DeviceDriver(&local_790.vkd);
      if (local_790.device.super_RefBase<vk::VkDevice_s_*>.m_data.object != (VkDevice)0x0) {
        (*local_790.device.super_RefBase<vk::VkDevice_s_*>.m_data.deleter.m_destroyDevice)
                  (local_790.device.super_RefBase<vk::VkDevice_s_*>.m_data.object,
                   local_790.device.super_RefBase<vk::VkDevice_s_*>.m_data.deleter.m_allocator);
      }
      local_790.device.super_RefBase<vk::VkDevice_s_*>.m_data.object = (VkDevice_s *)0x0;
      local_790.device.super_RefBase<vk::VkDevice_s_*>.m_data.deleter.m_destroyDevice =
           (DestroyDeviceFunc)0x0;
      local_790.device.super_RefBase<vk::VkDevice_s_*>.m_data.deleter.m_allocator =
           (VkAllocationCallbacks *)0x0;
      ::vk::InstanceDriver::~InstanceDriver(&local_790.deviceRes.vki);
      if (local_790.deviceRes.instance.object.super_RefBase<vk::VkInstance_s_*>.m_data.object !=
          (VkInstance)0x0) {
        (*local_790.deviceRes.instance.object.super_RefBase<vk::VkInstance_s_*>.m_data.deleter.
          m_destroyInstance)
                  (local_790.deviceRes.instance.object.super_RefBase<vk::VkInstance_s_*>.m_data.
                   object,local_790.deviceRes.instance.object.super_RefBase<vk::VkInstance_s_*>.
                          m_data.deleter.m_allocator);
      }
      local_790.deviceRes.instance.object.super_RefBase<vk::VkInstance_s_*>.m_data.object =
           (VkInstance_s *)0x0;
      local_790.deviceRes.instance.object.super_RefBase<vk::VkInstance_s_*>.m_data.deleter.
      m_destroyInstance = (DestroyInstanceFunc)0x0;
      local_790.deviceRes.instance.object.super_RefBase<vk::VkInstance_s_*>.m_data.deleter.
      m_allocator = (VkAllocationCallbacks *)0x0;
      if (bVar5) {
        bVar5 = ::vk::validateAndLog(context->m_testCtx->m_log,&local_8a0,0);
        ppDVar4 = (Deleter<vk::VkInstance_s_*> **)
                  &local_790.deviceRes.instance.object.super_RefBase<vk::VkInstance_s_*>.m_data.
                   deleter;
        local_790.deviceRes.instance._0_8_ = ppDVar4;
        if (bVar5) {
          if ((int)uVar14 == 0) {
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_790,"Allocation callbacks not called","");
            __return_storage_ptr__->m_code = QP_TEST_RESULT_QUALITY_WARNING;
            (__return_storage_ptr__->m_description)._M_dataplus._M_p = (pointer)paVar10;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)psVar1,local_790.deviceRes.instance._0_8_,
                       local_790.deviceRes.instance.object.super_RefBase<vk::VkInstance_s_*>.m_data.
                       object + local_790.deviceRes.instance._0_8_);
          }
          else if ((int)uVar14 == iVar13) {
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_790,"Max iter count reached; OOM testing incomplete","");
            __return_storage_ptr__->m_code = QP_TEST_RESULT_COMPATIBILITY_WARNING;
            (__return_storage_ptr__->m_description)._M_dataplus._M_p = (pointer)paVar10;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)psVar1,local_790.deviceRes.instance._0_8_,
                       local_790.deviceRes.instance.object.super_RefBase<vk::VkInstance_s_*>.m_data.
                       object + local_790.deviceRes.instance._0_8_);
          }
          else {
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_790,"Ok","");
            __return_storage_ptr__->m_code = QP_TEST_RESULT_PASS;
            (__return_storage_ptr__->m_description)._M_dataplus._M_p = (pointer)paVar10;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)psVar1,local_790.deviceRes.instance._0_8_,
                       local_790.deviceRes.instance.object.super_RefBase<vk::VkInstance_s_*>.m_data.
                       object + local_790.deviceRes.instance._0_8_);
          }
        }
        else {
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_790,"Invalid allocation callback","");
          __return_storage_ptr__->m_code = QP_TEST_RESULT_FAIL;
          (__return_storage_ptr__->m_description)._M_dataplus._M_p = (pointer)paVar10;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)psVar1,local_790.deviceRes.instance._0_8_,
                     local_790.deviceRes.instance.object.super_RefBase<vk::VkInstance_s_*>.m_data.
                     object + local_790.deviceRes.instance._0_8_);
        }
        if ((Deleter<vk::VkInstance_s_*> **)local_790.deviceRes.instance._0_8_ != ppDVar4) {
          operator_delete((void *)local_790.deviceRes.instance._0_8_,
                          (ulong)(local_790.deviceRes.instance.object.
                                  super_RefBase<vk::VkInstance_s_*>.m_data.deleter.m_destroyInstance
                                 + 1));
        }
      }
      ::vk::AllocationCallbackRecorder::~AllocationCallbackRecorder(&local_8a0);
      return __return_storage_ptr__;
    }
  }
  bVar5 = iVar6 == 2;
  goto LAB_004020ce;
}

Assistant:

tcu::TestStatus allocCallbackFailTest (Context& context, typename Object::Parameters params)
{
	AllocationCallbackRecorder			resCallbacks		(getSystemAllocator(), 128);
	const Environment					rootEnv				(context.getPlatformInterface(),
															 context.getDeviceInterface(),
															 context.getDevice(),
															 context.getUniversalQueueFamilyIndex(),
															 context.getBinaryCollection(),
															 resCallbacks.getCallbacks(),
															 1u);
	deUint32							numPassingAllocs	= 0;
	const deUint32						cmdLineIterCount	= (deUint32)context.getTestContext().getCommandLine().getTestIterationCount();
	const deUint32						maxTries			= cmdLineIterCount != 0 ? cmdLineIterCount : getOomIterLimit<Object>();

	{
		const EnvClone						resEnv	(rootEnv, getDefaulDeviceParameters(context), 1u);
		const typename Object::Resources	res		(resEnv.env, params);

		// Iterate over test until object allocation succeeds
		for (; numPassingAllocs < maxTries; ++numPassingAllocs)
		{
			DeterministicFailAllocator			objAllocator(getSystemAllocator(),
															 DeterministicFailAllocator::MODE_COUNT_AND_FAIL,
															 numPassingAllocs);
			AllocationCallbackRecorder			recorder	(objAllocator.getCallbacks(), 128);
			const Environment					objEnv		(resEnv.env.vkp,
															 resEnv.env.vkd,
															 resEnv.env.device,
															 resEnv.env.queueFamilyIndex,
															 resEnv.env.programBinaries,
															 recorder.getCallbacks(),
															 resEnv.env.maxResourceConsumers);
			bool								createOk	= false;

			context.getTestContext().getLog()
				<< TestLog::Message
				<< "Trying to create object with " << numPassingAllocs << " allocation" << (numPassingAllocs != 1 ? "s" : "") << " passing"
				<< TestLog::EndMessage;

			try
			{
				Unique<typename Object::Type>	obj	(Object::create(objEnv, res, params));
				createOk = true;
			}
			catch (const vk::OutOfMemoryError& e)
			{
				if (e.getError() != VK_ERROR_OUT_OF_HOST_MEMORY)
				{
					context.getTestContext().getLog() << e;
					return tcu::TestStatus::fail("Got invalid error code");
				}
			}

			if (!validateAndLog(context.getTestContext().getLog(), recorder, 0u))
				return tcu::TestStatus::fail("Invalid allocation callback");

			if (createOk)
			{
				context.getTestContext().getLog()
					<< TestLog::Message << "Object construction succeeded! " << TestLog::EndMessage;
				break;
			}
		}
	}

	if (!validateAndLog(context.getTestContext().getLog(), resCallbacks, 0u))
		return tcu::TestStatus::fail("Invalid allocation callback");

	if (numPassingAllocs == 0)
		return tcu::TestStatus(QP_TEST_RESULT_QUALITY_WARNING, "Allocation callbacks not called");
	else if (numPassingAllocs == maxTries)
		return tcu::TestStatus(QP_TEST_RESULT_COMPATIBILITY_WARNING, "Max iter count reached; OOM testing incomplete");
	else
		return tcu::TestStatus::pass("Ok");
}